

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O3

int Gia_ManToBridgeAbsNetlist(FILE *pFile,void *p,int pkg_type)

{
  uchar *pBuffer;
  Vec_Str_t *__ptr;
  
  __ptr = Gia_ManToBridgeVec((Gia_Man_t *)p);
  pBuffer = (uchar *)__ptr->pArray;
  Gia_CreateHeader(pFile,pkg_type,__ptr->nSize,pBuffer);
  if (pBuffer != (uchar *)0x0) {
    free(pBuffer);
  }
  free(__ptr);
  return 1;
}

Assistant:

int Gia_ManToBridgeAbsNetlist( FILE * pFile, void * p, int pkg_type )
{
    Vec_Str_t * vBuffer;
    vBuffer = Gia_ManToBridgeVec( (Gia_Man_t *)p );
    Gia_CreateHeader( pFile, pkg_type, Vec_StrSize(vBuffer), (unsigned char *)Vec_StrArray(vBuffer) );
    Vec_StrFree( vBuffer );
    return 1;
}